

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BitvecTestNotNull(Bitvec *p,u32 i)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = i - 1;
  if (uVar3 < p->iSize) {
    do {
      uVar1 = p->iDivisor;
      if (uVar1 == 0) {
        if (p->iSize < 0xf81) {
          return (int)(((p->u).aBitmap[uVar3 >> 3] >> (uVar3 & 7) & 1) != 0);
        }
        uVar2 = (ulong)(uVar3 % 0x7c);
        iVar4 = *(int *)((long)&p->u + uVar2 * 4);
        if (iVar4 == 0) {
          return 0;
        }
        do {
          if (iVar4 == uVar3 + 1) {
            return 1;
          }
          uVar1 = (int)uVar2 + 1;
          if (uVar1 == 0x7c) {
            uVar1 = 0;
          }
          uVar2 = (ulong)uVar1;
          iVar4 = *(int *)((long)&p->u + uVar2 * 4);
        } while (iVar4 != 0);
        return 0;
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 % uVar1;
      p = *(Bitvec **)((long)&p->u + (uVar2 / uVar1) * 8);
    } while (p != (Bitvec *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecTestNotNull(Bitvec *p, u32 i){
  assert( p!=0 );
  i--;
  if( i>=p->iSize ) return 0;
  while( p->iDivisor ){
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    p = p->u.apSub[bin];
    if (!p) {
      return 0;
    }
  }
  if( p->iSize<=BITVEC_NBIT ){
    return (p->u.aBitmap[i/BITVEC_SZELEM] & (1<<(i&(BITVEC_SZELEM-1))))!=0;
  } else{
    u32 h = BITVEC_HASH(i++);
    while( p->u.aHash[h] ){
      if( p->u.aHash[h]==i ) return 1;
      h = (h+1) % BITVEC_NINT;
    }
    return 0;
  }
}